

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTestContiguous.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionTestContiguous::write_cpp
          (InstructionTestContiguous *this,StreamSepMaker *ss,StreamSepMaker *es,
          CppEmitter *cpp_emitter)

{
  size_type sVar1;
  StreamSep *pSVar2;
  Transition *pTVar3;
  uint local_174;
  StreamSep local_170;
  int local_128;
  uint local_124;
  StreamSep local_120;
  int local_d4;
  StreamSep local_d0;
  uint local_74;
  StreamSep local_70;
  CppEmitter *local_28;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionTestContiguous *this_local;
  
  local_28 = cpp_emitter;
  cpp_emitter_local = (CppEmitter *)es;
  es_local = ss;
  ss_local = (StreamSepMaker *)this;
  sVar1 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                    (&(this->super_Instruction).next.
                      super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
  if (sVar1 == 1) {
    StreamSepMaker::operator<<(&local_70,es_local,(char (*) [9])0x24a01e);
    local_74 = this->nb_chars - ((byte)(this->super_Instruction).field_0x174 & 1);
    pSVar2 = StreamSep::operator<<(&local_70,&local_74);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_70);
    Instruction::write_trans(&this->super_Instruction,es_local,local_28,0);
  }
  else if (local_28->buffer_type == 3) {
    pTVar3 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
    if (pTVar3->inst->num_ordering != (this->super_Instruction).num_ordering + 1) {
      StreamSepMaker::operator<<(&local_d0,es_local,(char (*) [8])0x24a134);
      pTVar3 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_d4 = Instruction::get_id_gen(pTVar3->inst,local_28);
      pSVar2 = StreamSep::operator<<(&local_d0,&local_d4);
      StreamSep::operator<<(pSVar2,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_d0);
    }
  }
  else {
    StreamSepMaker::operator<<(&local_120,es_local,(char (*) [13])"if ( data + ");
    local_124 = this->nb_chars - ((byte)(this->super_Instruction).field_0x174 & 1);
    pSVar2 = StreamSep::operator<<(&local_120,&local_124);
    pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [20])" > end_m1 ) goto l_");
    pTVar3 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
    local_128 = Instruction::get_id_gen(pTVar3->inst,local_28);
    pSVar2 = StreamSep::operator<<(pSVar2,&local_128);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_120);
    StreamSepMaker::operator<<(&local_170,es_local,(char (*) [9])0x24a01e);
    local_174 = this->nb_chars - ((byte)(this->super_Instruction).field_0x174 & 1);
    pSVar2 = StreamSep::operator<<(&local_170,&local_174);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_170);
    Instruction::write_trans(&this->super_Instruction,es_local,local_28,0);
  }
  return;
}

Assistant:

void InstructionTestContiguous::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( next.size() == 1 ) {
        ss << "data += " << nb_chars - beg << ";";
        return write_trans( ss, cpp_emitter );
    }
    
    if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( next[ 1 ].inst->num_ordering != num_ordering + 1 )
            ss << "goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
    } else {
        ss << "if ( data + " << nb_chars - beg << " > end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "data += " << nb_chars - beg << ";";
        write_trans( ss, cpp_emitter );
    }
}